

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::
SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
::
emplace_back<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
          (SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
           *this,pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>
                 *args)

{
  undefined8 *puVar1;
  ulong uVar2;
  SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
  *p;
  Symbol *pSVar3;
  ConfigBlockSymbol *pCVar4;
  HierarchicalInstanceSyntax *pHVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
  *pSVar9;
  undefined8 *puVar10;
  long lVar11;
  long lVar12;
  SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
  *__src;
  ulong uVar13;
  long lVar14;
  
  __src = (SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
           *)(*(long *)(this + 8) * 0x20 + *(long *)this);
  if (*(long *)(this + 8) != *(long *)(this + 0x10)) {
    pSVar3 = (args->first).definition;
    pCVar4 = (args->first).configRoot;
    pHVar5 = args->second;
    *(ConfigRule **)(__src + 0x10) = (args->first).configRule;
    *(HierarchicalInstanceSyntax **)(__src + 0x18) = pHVar5;
    *(Symbol **)__src = pSVar3;
    *(ConfigBlockSymbol **)(__src + 8) = pCVar4;
    lVar11 = *(long *)(this + 8);
    *(long *)(this + 8) = lVar11 + 1;
    return (reference)(*(long *)this + (lVar11 + 1) * 0x20 + -0x20);
  }
  if (*(long *)(this + 8) == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar13 = *(long *)(this + 8) + 1;
  uVar2 = *(ulong *)(this + 0x10);
  if (uVar13 < uVar2 * 2) {
    uVar13 = uVar2 * 2;
  }
  if (0x3ffffffffffffff - uVar2 < uVar2) {
    uVar13 = 0x3ffffffffffffff;
  }
  lVar14 = (long)__src - *(long *)this;
  puVar10 = (undefined8 *)operator_new(uVar13 << 5);
  pSVar3 = (args->first).definition;
  pCVar4 = (args->first).configRoot;
  pHVar5 = args->second;
  puVar1 = (undefined8 *)((long)puVar10 + lVar14 + 0x10);
  *puVar1 = (args->first).configRule;
  puVar1[1] = pHVar5;
  *(undefined8 *)((long)puVar10 + lVar14) = pSVar3;
  ((undefined8 *)((long)puVar10 + lVar14))[1] = pCVar4;
  p = *(SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
        **)this;
  lVar11 = *(long *)(this + 8) * 0x20;
  pSVar9 = p;
  puVar1 = puVar10;
  if (p + (lVar11 - (long)__src) ==
      (SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
       *)0x0) {
    if (*(long *)(this + 8) != 0) {
      lVar12 = 0;
      do {
        uVar6 = *(undefined8 *)(p + lVar12);
        uVar7 = *(undefined8 *)(p + lVar12 + 8);
        uVar8 = *(undefined8 *)(p + lVar12 + 0x10 + 8);
        puVar1 = (undefined8 *)((long)puVar10 + lVar12 + 0x10);
        *puVar1 = *(undefined8 *)(p + lVar12 + 0x10);
        puVar1[1] = uVar8;
        *(undefined8 *)((long)puVar10 + lVar12) = uVar6;
        ((undefined8 *)((long)puVar10 + lVar12))[1] = uVar7;
        lVar12 = lVar12 + 0x20;
      } while (lVar11 != lVar12);
    }
  }
  else {
    for (; pSVar9 != __src; pSVar9 = pSVar9 + 0x20) {
      uVar6 = *(undefined8 *)pSVar9;
      uVar7 = *(undefined8 *)(pSVar9 + 8);
      uVar8 = *(undefined8 *)(pSVar9 + 0x18);
      puVar1[2] = *(undefined8 *)(pSVar9 + 0x10);
      puVar1[3] = uVar8;
      *puVar1 = uVar6;
      puVar1[1] = uVar7;
      puVar1 = puVar1 + 4;
    }
    memcpy((void *)((long)puVar10 + lVar14 + 0x20),__src,
           ((ulong)(p + (lVar11 - (long)__src) + -0x20) & 0xffffffffffffffe0) + 0x20);
  }
  if (p != this + 0x18) {
    operator_delete(p);
  }
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = uVar13;
  *(undefined8 **)this = puVar10;
  return (reference)((long)puVar10 + lVar14);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }